

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  pointer pcVar1;
  Iterator *pIVar2;
  char *pcVar3;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_001346a8;
  pcVar1 = (this->data_block_handle_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->data_block_handle_).field_2) {
    operator_delete(pcVar1);
  }
  pIVar2 = (this->data_iter_).iter_;
  if (pIVar2 != (Iterator *)0x0) {
    (*pIVar2->_vptr_Iterator[1])();
  }
  pIVar2 = (this->index_iter_).iter_;
  if (pIVar2 != (Iterator *)0x0) {
    (*pIVar2->_vptr_Iterator[1])();
  }
  pcVar3 = (this->status_).state_;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  Iterator::~Iterator(&this->super_Iterator);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;